

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O1

Result_Type
chaiscript::detail::Cast_Helper_Inner<chaiscript::exception::eval_error_*>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  element_type *this;
  bool bVar1;
  bad_any_cast *this_00;
  
  this = (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  if (((this->m_type_info).m_flags & 1) == 0) {
    bVar1 = Type_Info::operator==
                      (&this->m_type_info,(type_info *)&chaiscript::exception::eval_error::typeinfo)
    ;
    if (bVar1) {
      return (Result_Type)
             ((ob->m_data).
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_data_ptr;
    }
  }
  this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(this_00);
  __cxa_throw(this_00,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const() && ob.get_type_info() == typeid(Result))
          {
            return static_cast<Result *>(ob.get_ptr());
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }